

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O0

void __thiscall cmCTestLaunchReporter::LoadLabels(cmCTestLaunchReporter *this)

{
  cmAlphaNum *this_00;
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ulong uVar4;
  char *pcVar5;
  value_type local_310;
  undefined1 local_2f0 [8];
  string line;
  bool inSource;
  bool inTarget;
  long lStack_2c8;
  ifstream fin;
  undefined1 local_b0 [8];
  string source;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string fname;
  cmCTestLaunchReporter *this_local;
  
  fname.field_2._8_8_ = this;
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    cmAlphaNum::cmAlphaNum(&local_60,&this->OptionBuildDir);
    this_00 = (cmAlphaNum *)((long)&source.field_2 + 8);
    cmAlphaNum::cmAlphaNum(this_00,"/CMakeFiles/");
    cmStrCat<std::__cxx11::string,char[16]>
              ((string *)local_30,&local_60,this_00,&this->OptionTargetName,
               (char (*) [16])".dir/Labels.txt");
    std::__cxx11::string::string((string *)local_b0,(string *)&this->OptionSource);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_b0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    _Var3 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(&stack0xfffffffffffffd38,pcVar5,_Var3);
    bVar1 = std::ios::operator!((ios *)((long)&stack0xfffffffffffffd38 +
                                       *(long *)(lStack_2c8 + -0x18)));
    if ((bVar1 & 1) == 0) {
      line.field_2._M_local_buf[0xb] = '\x01';
      line.field_2._M_local_buf[10] = '\0';
      std::__cxx11::string::string((string *)local_2f0);
      while (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&stack0xfffffffffffffd38,(string *)local_2f0,(bool *)0x0,
                                0xffffffffffffffff), bVar2) {
        uVar4 = std::__cxx11::string::empty();
        if (((uVar4 & 1) == 0) &&
           (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_2f0), *pcVar5 != '#')) {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_2f0);
          if (*pcVar5 == ' ') {
            if (((line.field_2._M_local_buf[0xb] & 1U) != 0) ||
               ((line.field_2._M_local_buf[10] & 1U) != 0)) {
              std::__cxx11::string::substr((ulong)&local_310,(ulong)local_2f0);
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&this->Labels,&local_310);
              std::__cxx11::string::~string((string *)&local_310);
            }
          }
          else {
            uVar4 = std::__cxx11::string::empty();
            if (((uVar4 & 1) != 0) || ((line.field_2._M_local_buf[10] & 1U) != 0)) {
              line.field_2._12_4_ = 1;
              goto LAB_001e4fd8;
            }
            line.field_2._M_local_buf[0xb] = '\0';
            line.field_2._M_local_buf[10] =
                 SourceMatches(this,(string *)local_2f0,(string *)local_b0);
          }
        }
      }
      line.field_2._12_4_ = 0;
LAB_001e4fd8:
      std::__cxx11::string::~string((string *)local_2f0);
    }
    else {
      line.field_2._12_4_ = 1;
    }
    std::ifstream::~ifstream(&stack0xfffffffffffffd38);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void cmCTestLaunchReporter::LoadLabels()
{
  if (this->OptionBuildDir.empty() || this->OptionTargetName.empty()) {
    return;
  }

  // Labels are listed in per-target files.
  std::string fname = cmStrCat(this->OptionBuildDir, "/CMakeFiles/",
                               this->OptionTargetName, ".dir/Labels.txt");

  // We are interested in per-target labels for this source file.
  std::string source = this->OptionSource;
  cmSystemTools::ConvertToUnixSlashes(source);

  // Load the labels file.
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  if (!fin) {
    return;
  }
  bool inTarget = true;
  bool inSource = false;
  std::string line;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (line.empty() || line[0] == '#') {
      // Ignore blank and comment lines.
      continue;
    }
    if (line[0] == ' ') {
      // Label lines appear indented by one space.
      if (inTarget || inSource) {
        this->Labels.insert(line.substr(1));
      }
    } else if (!this->OptionSource.empty() && !inSource) {
      // Non-indented lines specify a source file name.  The first one
      // is the end of the target-wide labels.  Use labels following a
      // matching source.
      inTarget = false;
      inSource = this->SourceMatches(line, source);
    } else {
      return;
    }
  }
}